

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
::matches(Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
          *this,candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_>
                *candidate)

{
  bool bVar1;
  Literal local_80;
  Literal local_68;
  Literal local_50;
  undefined1 auStack_38 [8];
  matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> casted;
  MatchSelf<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> local_11;
  
  auStack_38 = (undefined1  [8])0x0;
  casted.field_0.i64 = 0;
  casted.field_0.func.super_IString.str._M_str = (char *)0x0;
  Literal::Literal(&local_80,candidate);
  Literal::operator=((Literal *)auStack_38,&local_80);
  Literal::~Literal(&local_80);
  if (this->binder != (Literal *)0x0) {
    Literal::operator=(this->binder,(Literal *)auStack_38);
  }
  Literal::Literal(&local_68,(Literal *)auStack_38);
  bVar1 = MatchSelf<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_>::operator()
                    (&local_11,&local_68);
  if (bVar1) {
    Literal::Literal(&local_50,(Literal *)auStack_38);
    bVar1 = Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
            ::match(&local_50,&this->submatchers);
    Literal::~Literal(&local_50);
  }
  else {
    bVar1 = false;
  }
  Literal::~Literal(&local_68);
  Literal::~Literal((Literal *)auStack_38);
  return bVar1;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }